

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

void __thiscall QSplitter::QSplitter(QSplitter *this,Orientation orientation,QWidget *parent)

{
  long lVar1;
  EVP_PKEY_CTX *ctx;
  QSplitterPrivate *this_00;
  QWidget *in_RDX;
  Orientation in_ESI;
  QFramePrivate *in_RDI;
  long in_FS_OFFSET;
  QSplitterPrivate *d;
  QSplitterPrivate *in_stack_ffffffffffffffc0;
  QFrame *in_stack_ffffffffffffffd0;
  QWidget *pQVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ctx = (EVP_PKEY_CTX *)operator_new(0x2b0);
  QSplitterPrivate::QSplitterPrivate(in_stack_ffffffffffffffc0);
  pQVar2 = in_RDX;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x69c350);
  QFrame::QFrame(in_stack_ffffffffffffffd0,in_RDI,in_RDX,
                 (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)pQVar2 >> 0x20,0));
  *(undefined ***)&in_RDI->super_QWidgetPrivate = &PTR_metaObject_00d1bdc0;
  *(undefined ***)&(in_RDI->super_QWidgetPrivate).field_0x10 = &PTR__QSplitter_00d1bf80;
  this_00 = d_func((QSplitter *)0x69c38c);
  this_00->orient = in_ESI;
  QSplitterPrivate::init(this_00,ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSplitter::QSplitter(Qt::Orientation orientation, QWidget *parent)
    : QFrame(*new QSplitterPrivate, parent)
{
    Q_D(QSplitter);
    d->orient = orientation;
    d->init();
}